

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall spdlog::logger::logger(logger *this,string *name,sink_ptr *single_sink)

{
  string *in_RSI;
  shared_ptr<spdlog::sinks::sink> *in_stack_ffffffffffffff48;
  shared_ptr<spdlog::sinks::sink> *in_stack_ffffffffffffff50;
  undefined1 **local_90;
  string *in_stack_ffffffffffffff98;
  logger *in_stack_ffffffffffffffa0;
  sinks_init_list in_stack_ffffffffffffffa8;
  undefined1 *local_48;
  undefined8 local_40;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  std::shared_ptr<spdlog::sinks::sink>::shared_ptr
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_40 = 1;
  local_48 = &stack0xffffffffffffffa8;
  logger(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa8);
  local_90 = &local_48;
  do {
    local_90 = local_90 + -2;
    std::shared_ptr<spdlog::sinks::sink>::~shared_ptr((shared_ptr<spdlog::sinks::sink> *)0x1b50eb);
  } while (local_90 != (undefined1 **)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

logger(std::string name, sink_ptr single_sink)
        : logger(std::move(name), {std::move(single_sink)})
    {}